

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::AppendCatch(BinaryReaderIR *this,Catch *catch_)

{
  pointer pCVar1;
  LabelNode *pLVar2;
  bool bVar3;
  Result RVar4;
  TryExpr *pTVar5;
  char *format;
  LabelNode *label;
  
  label = (LabelNode *)0x0;
  RVar4 = TopLabel(this,&label);
  pLVar2 = label;
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  if (label->label_type == Try) {
    pTVar5 = cast<wabt::TryExpr,wabt::Expr>(label->context);
    bVar3 = Catch::IsCatchAll(catch_);
    if (((!bVar3) ||
        (pCVar1 = (pTVar5->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                  _M_impl.super__Vector_impl_data._M_finish,
        (pTVar5->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start == pCVar1)) ||
       (bVar3 = Catch::IsCatchAll(pCVar1 + -1), !bVar3)) {
      if (pTVar5->kind != Catch) {
        if (pTVar5->kind != Plain) {
          format = "catch not allowed in try-delegate";
          goto LAB_0014a922;
        }
        pTVar5->kind = Catch;
      }
      std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                (&pTVar5->catches,catch_);
      pLVar2->exprs =
           &(pTVar5->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].exprs;
      return (Result)Ok;
    }
    format = "only one catch_all allowed in try block";
  }
  else {
    format = "catch not inside try block";
  }
LAB_0014a922:
  PrintError(this,format);
  return (Result)Error;
}

Assistant:

Result BinaryReaderIR::AppendCatch(Catch&& catch_) {
  LabelNode* label = nullptr;
  CHECK_RESULT(TopLabel(&label));

  if (label->label_type != LabelType::Try) {
    PrintError("catch not inside try block");
    return Result::Error;
  }

  auto* try_ = cast<TryExpr>(label->context);

  if (catch_.IsCatchAll() && !try_->catches.empty() &&
      try_->catches.back().IsCatchAll()) {
    PrintError("only one catch_all allowed in try block");
    return Result::Error;
  }

  if (try_->kind == TryKind::Plain) {
    try_->kind = TryKind::Catch;
  } else if (try_->kind != TryKind::Catch) {
    PrintError("catch not allowed in try-delegate");
    return Result::Error;
  }

  try_->catches.push_back(std::move(catch_));
  label->exprs = &try_->catches.back().exprs;
  return Result::Ok;
}